

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O1

int dbon(void)

{
  schar sVar1;
  uint uVar2;
  
  uVar2 = 0;
  sVar1 = acurr(0);
  if (u.umonnum == u.umonster) {
    uVar2 = 0xffffffff;
    if (('\x05' < sVar1) && (uVar2 = 0, '\x0f' < sVar1)) {
      uVar2 = 1;
      if (('\x11' < sVar1) &&
         (((uVar2 = 2, sVar1 != '\x12' && (uVar2 = 3, ']' < sVar1)) && (uVar2 = 4, 'l' < sVar1)))) {
        uVar2 = 5;
        if ('u' < sVar1) {
          uVar2 = sVar1 == 'v' ^ 7;
        }
      }
    }
    if ((uwep != (obj *)0x0) && ((byte)(uwep->oclass | 4U) == 6)) {
      uVar2 = uVar2 << (objects[uwep->otyp].field_0x11 & 1);
    }
  }
  return uVar2;
}

Assistant:

int dbon(void)
{
	int str = ACURR(A_STR);
	int bonus = 0;

	if (Upolyd) return 0;

	if (str < 6) bonus = -1;
	else if (str < 16) bonus = 0;
	else if (str < 18) bonus = 1;
	else if (str == 18) bonus = 2;		/* up to 18 */
	else if (str <= STR18(75)) bonus = 3;	/* up to 18/75 */
	else if (str <= STR18(90)) bonus = 4;	/* up to 18/90 */
	else if (str < STR18(100)) bonus = 5;	/* up to 18/99 */
	else if (str == STR18(100)) bonus = 6;	/* 18/ ** only */
	else bonus = 7;		/* Gauntlets of Power or 18/ ** exceeded */

	/* HASAAAAAN CHOP!
	 *
	 * If you're wielding a two-handed weapon, let's just, hmm,
	 * double this bonus.  Yes, even when negative; those are HEAVY.
	 *
	 * This should sharply increase the appeal of two-handers
	 * compared to #twoweapon.
	 */
	if (uwep && bimanual(uwep)) bonus *= 2;

	return bonus;
}